

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O0

void VW::validate_default_bits(vw *all,uint32_t local_num_bits)

{
  string *pmessage;
  ostream *poVar1;
  undefined8 uVar2;
  uint in_ESI;
  long in_RDI;
  stringstream __msg;
  undefined4 in_stack_fffffffffffffe34;
  int plineNumber;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_198 [16];
  ostream local_188;
  uint local_c;
  long local_8;
  
  if (((*(byte *)(in_RDI + 0x54) & 1) != 1) && (*(uint *)(in_RDI + 0x50) != in_ESI)) {
    local_c = in_ESI;
    local_8 = in_RDI;
    std::__cxx11::stringstream::stringstream(local_198);
    pmessage = (string *)std::operator<<(&local_188,"-b bits mismatch: command-line ");
    poVar1 = (ostream *)std::ostream::operator<<(pmessage,*(uint *)(local_8 + 0x50));
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    std::operator<<(poVar1," stored in model");
    plineNumber = CONCAT13(1,(int3)in_stack_fffffffffffffe34);
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    vw_exception::vw_exception
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,plineNumber,pmessage);
    __cxa_throw(uVar2,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  return;
}

Assistant:

void validate_default_bits(vw& all, uint32_t local_num_bits)
{
  if (all.default_bits != true && all.num_bits != local_num_bits)
    THROW("-b bits mismatch: command-line " << all.num_bits << " != " << local_num_bits << " stored in model");
}